

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.cpp
# Opt level: O2

void polyscope::screenshot(bool transparentBG)

{
  bool bVar1;
  allocator local_e9;
  string local_e8;
  string local_c8;
  string local_a8;
  string defaultName;
  char buff [50];
  
  snprintf(buff,0x32,"screenshot_%06zu%s",state::screenshotInd,
           options::screenshotExtension_abi_cxx11_);
  std::__cxx11::string::string((string *)&defaultName,buff,&local_e9);
  std::__cxx11::string::string
            ((string *)&local_a8,(string *)&options::screenshotExtension_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_c8,".png",&local_e9);
  bVar1 = anon_unknown_3::hasExtension(&local_a8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_e8,(string *)&defaultName);
  screenshot(&local_e8,bVar1 && transparentBG);
  std::__cxx11::string::~string((string *)&local_e8);
  state::screenshotInd = state::screenshotInd + 1;
  std::__cxx11::string::~string((string *)&defaultName);
  return;
}

Assistant:

void screenshot(bool transparentBG) {

  char buff[50];
  snprintf(buff, 50, "screenshot_%06zu%s", state::screenshotInd, options::screenshotExtension.c_str());
  std::string defaultName(buff);

  // only pngs can be written with transparency
  if (!hasExtension(options::screenshotExtension, ".png")) {
    transparentBG = false;
  }

  screenshot(defaultName, transparentBG);

  state::screenshotInd++;
}